

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int read_times(FILE *statfile_fp,uint numcpus,uv_cpu_info_t *ci)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint local_48c;
  int r;
  uint n;
  char buf [1024];
  uint len;
  uint num;
  unsigned_long irq;
  unsigned_long dummy;
  unsigned_long idle;
  unsigned_long sys;
  unsigned_long nice;
  unsigned_long user;
  uv_cpu_times_s ts;
  unsigned_long clock_ticks;
  uv_cpu_info_t *ci_local;
  uint numcpus_local;
  FILE *statfile_fp_local;
  
  ts.irq = sysconf(2);
  if (ts.irq == 0xffffffffffffffff) {
    __assert_fail("clock_ticks != (unsigned long) -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                  ,0x2da,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
  }
  if (ts.irq != 0) {
    rewind((FILE *)statfile_fp);
    pcVar2 = fgets((char *)&r,0x400,(FILE *)statfile_fp);
    if (pcVar2 == (char *)0x0) {
      abort();
    }
    buf[0x3fc] = '\0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    while( true ) {
      pcVar2 = fgets((char *)&r,0x400,(FILE *)statfile_fp);
      if (((pcVar2 == (char *)0x0) || (numcpus <= (uint)buf._1020_4_)) ||
         (iVar1 = strncmp((char *)&r,"cpu",3), iVar1 != 0)) {
        if (buf._1020_4_ != numcpus) {
          __assert_fail("num == numcpus",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x30b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        return 0;
      }
      iVar1 = __isoc99_sscanf(&r,"cpu%u ",&local_48c);
      if (iVar1 != 1) {
        __assert_fail("r == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                      ,0x2ef,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
      }
      buf[0x3f8] = '\x05';
      buf[0x3f9] = '\0';
      buf[0x3fa] = '\0';
      buf[0x3fb] = '\0';
      while (local_48c = local_48c / 10, local_48c != 0) {
        buf._1016_4_ = buf._1016_4_ + 1;
      }
      iVar1 = __isoc99_sscanf((long)&r + (ulong)(uint)buf._1016_4_,"%lu %lu %lu %lu %lu %lu",&nice,
                              &sys,&idle,&dummy,&irq,&len);
      if (iVar1 != 6) break;
      user = ts.irq * nice;
      ts.user = ts.irq * sys;
      ts.nice = ts.irq * idle;
      ts.sys = ts.irq * dummy;
      ts.idle = ts.irq * _len;
      uVar3 = (ulong)(uint)buf._1020_4_;
      buf._1020_4_ = buf._1020_4_ + 1;
      memcpy(&ci[uVar3].cpu_times,&user,0x28);
    }
    abort();
  }
  __assert_fail("clock_ticks != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                ,0x2db,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
}

Assistant:

static int read_times(FILE* statfile_fp,
                      unsigned int numcpus,
                      uv_cpu_info_t* ci) {
  unsigned long clock_ticks;
  struct uv_cpu_times_s ts;
  unsigned long user;
  unsigned long nice;
  unsigned long sys;
  unsigned long idle;
  unsigned long dummy;
  unsigned long irq;
  unsigned int num;
  unsigned int len;
  char buf[1024];

  clock_ticks = sysconf(_SC_CLK_TCK);
  assert(clock_ticks != (unsigned long) -1);
  assert(clock_ticks != 0);

  rewind(statfile_fp);

  if (!fgets(buf, sizeof(buf), statfile_fp))
    abort();

  num = 0;

  while (fgets(buf, sizeof(buf), statfile_fp)) {
    if (num >= numcpus)
      break;

    if (strncmp(buf, "cpu", 3))
      break;

    /* skip "cpu<num> " marker */
    {
      unsigned int n;
      int r = sscanf(buf, "cpu%u ", &n);
      assert(r == 1);
      (void) r;  /* silence build warning */
      for (len = sizeof("cpu0"); n /= 10; len++);
    }

    /* Line contains user, nice, system, idle, iowait, irq, softirq, steal,
     * guest, guest_nice but we're only interested in the first four + irq.
     *
     * Don't use %*s to skip fields or %ll to read straight into the uint64_t
     * fields, they're not allowed in C89 mode.
     */
    if (6 != sscanf(buf + len,
                    "%lu %lu %lu %lu %lu %lu",
                    &user,
                    &nice,
                    &sys,
                    &idle,
                    &dummy,
                    &irq))
      abort();

    ts.user = clock_ticks * user;
    ts.nice = clock_ticks * nice;
    ts.sys  = clock_ticks * sys;
    ts.idle = clock_ticks * idle;
    ts.irq  = clock_ticks * irq;
    ci[num++].cpu_times = ts;
  }
  assert(num == numcpus);

  return 0;
}